

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottieitem.cpp
# Opt level: O0

void __thiscall
rlottie::internal::renderer::Layer::update
          (Layer *this,int frameNumber,VMatrix *parentMatrix,float parentAlpha)

{
  bool bVar1;
  VMatrix *in_RDX;
  int in_ESI;
  Layer *in_RDI;
  float in_XMM0_Da;
  float fVar2;
  VMatrix m;
  float alpha;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  bool bVar3;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  vFlag<rlottie::internal::renderer::DirtyFlagBit> in_stack_ffffffffffffffb0;
  vFlag<rlottie::internal::renderer::DirtyFlagBit> in_stack_ffffffffffffffb4;
  undefined1 local_48 [4];
  float in_stack_ffffffffffffffbc;
  VMatrix *in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffcc;
  LayerMask *in_stack_ffffffffffffffd0;
  float fVar4;
  undefined4 in_stack_fffffffffffffff0;
  
  in_RDI->mFrameNo = in_ESI;
  bVar1 = visible((Layer *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  if (bVar1) {
    fVar4 = in_XMM0_Da;
    frameNo(in_RDI);
    fVar2 = opacity((Layer *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                    in_stack_ffffffffffffff8c);
    in_XMM0_Da = in_XMM0_Da * fVar2;
    bVar1 = vIsZero(0.0);
    if (bVar1) {
      in_RDI->mCombinedAlpha = 0.0;
    }
    else {
      frameNo(in_RDI);
      matrix((Layer *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),(int)((ulong)in_RDX >> 0x20));
      VMatrix::operator*=(in_RDX,(VMatrix *)CONCAT44(fVar4,in_XMM0_Da));
      bVar1 = VMatrix::operator!=((VMatrix *)
                                  CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                                  (VMatrix *)
                                  CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      if (bVar1) {
        vFlag<rlottie::internal::renderer::DirtyFlagBit>::operator|=(&in_RDI->mDirtyFlag,Matrix);
        memcpy(&in_RDI->mCombinedMatrix,local_48,0x26);
      }
      bVar1 = vCompare(0.0,2.018074e-39);
      if (!bVar1) {
        vFlag<rlottie::internal::renderer::DirtyFlagBit>::operator|=(&in_RDI->mDirtyFlag,Alpha);
        in_RDI->mCombinedAlpha = in_XMM0_Da;
      }
      bVar1 = std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr<rlottie::internal::renderer::LayerMask,_std::default_delete<rlottie::internal::renderer::LayerMask>_>
                          *)0x15f9c7);
      if (bVar1) {
        std::
        unique_ptr<rlottie::internal::renderer::LayerMask,_std::default_delete<rlottie::internal::renderer::LayerMask>_>
        ::operator->((unique_ptr<rlottie::internal::renderer::LayerMask,_std::default_delete<rlottie::internal::renderer::LayerMask>_>
                      *)0x15f9db);
        frameNo(in_RDI);
        LayerMask::update(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,
                          in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
                          (DirtyFlag *)
                          CONCAT44(in_stack_ffffffffffffffb4.i,in_stack_ffffffffffffffb0.i));
      }
      bVar1 = internal::model::Layer::precompLayer(in_RDI->mLayerData);
      bVar3 = false;
      if (!bVar1) {
        flag(in_RDI);
        bVar1 = vFlag<rlottie::internal::renderer::DirtyFlagBit>::testFlag
                          ((vFlag<rlottie::internal::renderer::DirtyFlagBit> *)
                           &stack0xffffffffffffffb4,None);
        bVar3 = false;
        if (bVar1) {
          bVar3 = isStatic((Layer *)0x15fa59);
        }
      }
      if (bVar3 == false) {
        (*in_RDI->_vptr_Layer[8])();
        vFlag<rlottie::internal::renderer::DirtyFlagBit>::vFlag
                  ((vFlag<rlottie::internal::renderer::DirtyFlagBit> *)&stack0xffffffffffffffb0,None
                  );
        (in_RDI->mDirtyFlag).i = in_stack_ffffffffffffffb0.i;
      }
    }
  }
  return;
}

Assistant:

void renderer::Layer::update(int frameNumber, const VMatrix &parentMatrix,
                             float parentAlpha)
{
    mFrameNo = frameNumber;
    // 1. check if the layer is part of the current frame
    if (!visible()) return;

    float alpha = parentAlpha * opacity(frameNo());
    if (vIsZero(alpha)) {
        mCombinedAlpha = 0;
        return;
    }

    // 2. calculate the parent matrix and alpha
    VMatrix m = matrix(frameNo());
    m *= parentMatrix;

    // 3. update the dirty flag based on the change
    if (mCombinedMatrix != m) {
        mDirtyFlag |= DirtyFlagBit::Matrix;
        mCombinedMatrix = m;
    }

    if (!vCompare(mCombinedAlpha, alpha)) {
        mDirtyFlag |= DirtyFlagBit::Alpha;
        mCombinedAlpha = alpha;
    }

    // 4. update the mask
    if (mLayerMask) {
        mLayerMask->update(frameNo(), mCombinedMatrix, mCombinedAlpha,
                           mDirtyFlag);
    }

    // 5. if no parent property change and layer is static then nothing to do.
    if (!mLayerData->precompLayer() && flag().testFlag(DirtyFlagBit::None) &&
        isStatic())
        return;

    // 6. update the content of the layer
    updateContent();

    // 7. reset the dirty flag
    mDirtyFlag = DirtyFlagBit::None;
}